

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

int glslang::TIntermediate::getBaseAlignmentScalar(TType *type,int *size)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  iVar1 = (*type->_vptr_TType[7])();
  iVar3 = 8;
  switch(iVar1) {
  case 2:
  case 10:
  case 0xb:
  case 0x12:
    break;
  case 3:
  case 6:
  case 7:
    iVar3 = 2;
    break;
  case 4:
  case 5:
    iVar3 = 1;
    break;
  default:
    iVar3 = 4;
    break;
  case 0xe:
    iVar1 = (*type->_vptr_TType[0x2e])(type);
    if ((char)iVar1 == '\0') {
      uVar2 = (*type->_vptr_TType[0x2f])(type);
      iVar3 = (uVar2 & 0xff) * 4 + 4;
    }
  }
  *size = iVar3;
  return iVar3;
}

Assistant:

int TIntermediate::getBaseAlignmentScalar(const TType& type, int& size)
{
    switch (type.getBasicType()) {
    case EbtInt64:
    case EbtUint64:
    case EbtDouble:  size = 8; return 8;
    case EbtFloat16: size = 2; return 2;
    case EbtInt8:
    case EbtUint8:   size = 1; return 1;
    case EbtInt16:
    case EbtUint16:  size = 2; return 2;
    case EbtReference: size = 8; return 8;
    case EbtSampler:
    {
        if (type.isBindlessImage() || type.isBindlessTexture()) {
            size = 8; return 8;
        }
        else {
            size = 4; return 4;
        }
    }
    default:         size = 4; return 4;
    }
}